

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O1

void DebugDer(ostream *outFile,uchar *pIn,size_t cbIn,unsigned_long level)

{
  byte bVar1;
  long lVar2;
  undefined1 uVar3;
  size_t cbIn_00;
  bool bVar4;
  ostream oVar5;
  ostream *poVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  BasicDerType local_98;
  long local_88;
  uchar *local_80;
  size_t local_78;
  unsigned_long local_70;
  size_t local_68;
  size_t cbRead;
  ostream *local_58;
  undefined1 local_4c [8];
  DerTypeContainer type;
  size_t local_38;
  size_t size;
  
  type._4_8_ = pIn;
  if (1 < cbIn) {
    uVar10 = 0;
    local_38 = 0;
    local_68 = 0;
    local_70 = level + 1;
    local_88 = (long)(int)local_70;
    cbRead = cbIn;
    local_58 = outFile;
    while( true ) {
      bVar1 = *(byte *)(type._4_8_ + uVar10);
      local_4c._0_4_ = bVar1 & (BMPString|Boolean);
      local_4c._4_4_ = ZEXT14(bVar1 >> 6);
      type.type._0_1_ = bVar1 >> 5 & Boolean;
      bVar4 = DecodeSize((byte *)(type._4_8_ + uVar10) + 1,cbIn - (uVar10 + 1),&local_38,&local_68);
      if (!bVar4) break;
      poVar7 = outFile + *(long *)(*(long *)outFile + -0x18);
      lVar9 = uVar10 + 1 + local_68;
      if (outFile[*(long *)(*(long *)outFile + -0x18) + 0xe1] == (ostream)0x0) {
        oVar5 = (ostream)std::ios::widen((char)poVar7);
        poVar7[0xe0] = oVar5;
        poVar7[0xe1] = (ostream)0x1;
      }
      poVar7[0xe0] = (ostream)0x20;
      *(long *)(outFile + *(long *)(*(long *)outFile + -0x18) + 0x10) = local_88;
      std::__ostream_insert<char,std::char_traits<char>>(outFile,"  ",2);
      uVar3 = (undefined1)type.type;
      poVar6 = operator<<(outFile,(DerTypeContainer *)local_4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," 0x",3);
      poVar7 = poVar6 + *(long *)(*(long *)poVar6 + -0x18);
      if (uVar3 == Boolean) {
        if (poVar6[*(long *)(*(long *)poVar6 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar5 = (ostream)std::ios::widen((char)poVar7);
          poVar7[0xe0] = oVar5;
          poVar7[0xe1] = (ostream)0x1;
        }
        cbIn_00 = local_38;
        poVar7[0xe0] = (ostream)0x30;
        lVar2 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        outFile = local_58;
        DebugDer(local_58,(uchar *)(type._4_8_ + lVar9),cbIn_00,local_70);
        cbIn = cbRead;
      }
      else {
        if (poVar6[*(long *)(*(long *)poVar6 + -0x18) + 0xe1] == (ostream)0x0) {
          oVar5 = (ostream)std::ios::widen((char)poVar7);
          poVar7[0xe0] = oVar5;
          poVar7[0xe1] = (ostream)0x1;
        }
        cbIn = cbRead;
        local_80 = (uchar *)(type._4_8_ + uVar10);
        local_78 = cbRead - uVar10;
        poVar7[0xe0] = (ostream)0x30;
        lVar2 = *(long *)poVar6;
        *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        BasicDerType::BasicDerType(&local_98,local_80,local_78);
        poVar7 = operator<<(poVar7,&local_98);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        outFile = local_58;
      }
      uVar10 = lVar9 + local_38;
      if (cbIn <= uVar10) {
        return;
      }
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = std::__throw_bad_cast;
  __cxa_throw(puVar8,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void DebugDer(std::ostream& outFile, const unsigned char * pIn, size_t cbIn, unsigned long level)
{
	if (cbIn < 2)
		throw std::exception(); // Corrupt input

	size_t size = 0;
	size_t cbRead = 0;
	size_t offset = 0;

	while (offset < cbIn)
	{
		DerTypeContainer type(*(pIn + offset));
		const unsigned char* pType = pIn + offset;
		size_t cbType = cbIn - offset;

		offset += 1;
		if (!DecodeSize(pIn + offset, cbIn - offset, size, cbRead))
			throw std::exception(); // Corrupt input

		offset += cbRead;

        outFile << std::setfill(' ') << std::setw(level + 1) << "  ";

		if (type.constructed)
		{
			// It is a set, or sequence, possibly app-specific
			// Print just the type, and the size, then recurse
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << std::endl;
			DebugDer(outFile, pIn + offset, size, level + 1);
		}
		else
		{
			// It is a primitive type
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << " " << BasicDerType(pType, cbType) << std::endl;
		}

		// And increment to the next item
		offset += static_cast<size_t>(size);

	}

}